

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::OutputFile::breakScanLine(OutputFile *this,int y,int offset,int length,char c)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  unsigned_long uVar2;
  OutputStreamMutex *pOVar3;
  OStream *pOVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  char local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  local_1b1 = c;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pDVar1 = this->_data;
  uVar2 = (pDVar1->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[(y - pDVar1->minY) / pDVar1->linesInBuffer];
  if (uVar2 != 0) {
    pOVar3 = pDVar1->_streamData;
    pOVar3->currentPosition = 0;
    pOVar4 = pOVar3->os;
    (*pOVar4->_vptr_OStream[4])(pOVar4,uVar2 + (long)offset);
    if (0 < length) {
      do {
        pOVar4 = this->_data->_streamData->os;
        (*pOVar4->_vptr_OStream[2])(pOVar4,&local_1b1,1);
        length = length + -1;
      } while (length != 0);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Cannot overwrite scan line ",0x1b);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,y);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,". The scan line has not yet been stored in file \"",0x31);
  pcVar7 = OStream::fileName(this->_data->_streamData->os);
  poVar6 = std::operator<<(poVar6,pcVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)local_1b0);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void	
OutputFile::breakScanLine  (int y, int offset, int length, char c)
{
    Lock lock (*_data->_streamData);

    Int64 position = 
	_data->lineOffsets[(y - _data->minY) / _data->linesInBuffer];

    if (!position)
	THROW (IEX_NAMESPACE::ArgExc, "Cannot overwrite scan line " << y << ". "
			    "The scan line has not yet been stored in "
			    "file \"" << fileName() << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}